

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::
     iuUniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::Print(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,iu_ostream *os
            )

{
  char *__s;
  size_t sVar1;
  
  __s = (value->_M_dataplus)._M_p;
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
    return;
  }
  std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }